

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O0

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,AssignmentNode *node)

{
  bool bVar1;
  __optional_eq_t<TypeName,_TypeName> _Var2;
  string *psVar3;
  reference_wrapper<Symbol> *this_00;
  Symbol *pSVar4;
  AssignmentOperator *pAVar5;
  shared_ptr<ExpressionNode> *__lhs;
  element_type *peVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  mapped_type *__rhs_00;
  AssignmentNode *in_RSI;
  undefined8 in_RDI;
  optional<std::reference_wrapper<Symbol>_> oVar7;
  TypeChecker typeChecker;
  VariableAnalyser analyser;
  optional<std::reference_wrapper<Symbol>_> symbol;
  string name;
  SymbolTable *in_stack_fffffffffffffde8;
  VariableAnalyser *in_stack_fffffffffffffdf0;
  optional<TypeName> *in_stack_fffffffffffffdf8;
  optional<TypeName> *in_stack_fffffffffffffe00;
  __optional_ne_t<TypeName,_TypeName> local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  int maxDepth;
  undefined6 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 in_stack_fffffffffffffe4f;
  SymbolTable *in_stack_fffffffffffffe50;
  TypeChecker local_f0 [2];
  undefined4 local_b4;
  _Optional_payload_base<TypeName> local_b0;
  VariableAnalyser local_88 [3];
  _Storage<std::reference_wrapper<Symbol>,_true> local_40;
  undefined1 local_38;
  string local_30 [24];
  Node *in_stack_ffffffffffffffe8;
  
  maxDepth = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  psVar3 = AssignmentNode::getName_abi_cxx11_(in_RSI);
  std::__cxx11::string::string(local_30,(string *)psVar3);
  oVar7 = SymbolTable::lookup(in_stack_fffffffffffffe50,
                              (string *)
                              CONCAT17(in_stack_fffffffffffffe4f,
                                       CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)
                                      ),maxDepth);
  local_40 = oVar7.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload;
  local_38 = oVar7.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::reference_wrapper<Symbol>_> *)0x179813);
  if (!bVar1) {
    std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    reportError((string *)in_RSI,in_stack_ffffffffffffffe8);
  }
  VariableAnalyser::VariableAnalyser(in_stack_fffffffffffffdf0);
  this_00 = std::optional<std::reference_wrapper<Symbol>_>::value
                      ((optional<std::reference_wrapper<Symbol>_> *)in_stack_fffffffffffffdf0);
  pSVar4 = std::reference_wrapper<Symbol>::get(this_00);
  (*pSVar4->_vptr_Symbol[2])(pSVar4,local_88);
  bVar1 = VariableAnalyser::isSymbolValid(local_88);
  if (!bVar1) {
    std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    reportError((string *)in_RSI,in_stack_ffffffffffffffe8);
  }
  local_b0 = (_Optional_payload_base<TypeName>)VariableAnalyser::getType(local_88);
  local_b4 = 1;
  _Var2 = std::operator==((optional<TypeName> *)in_stack_fffffffffffffdf0,
                          (TypeName *)in_stack_fffffffffffffde8);
  bVar1 = false;
  if (_Var2) {
    pAVar5 = AssignmentNode::getOperation(in_RSI);
    bVar1 = *pAVar5 != Assign;
  }
  if (bVar1) {
    std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    reportError((string *)in_RSI,in_stack_ffffffffffffffe8);
  }
  __lhs = AssignmentNode::getValue(in_RSI);
  peVar6 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x179a5d);
  (*(peVar6->super_Node)._vptr_Node[2])(peVar6,in_RDI);
  TypeChecker::TypeChecker((TypeChecker *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          AssignmentNode::getValue(in_RSI);
  peVar6 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x179aac);
  (*(peVar6->super_Node)._vptr_Node[2])(peVar6,local_f0);
  TypeChecker::getType(local_f0);
  bVar1 = std::optional<TypeName>::has_value((optional<TypeName> *)0x179ae0);
  local_1d9 = false;
  if (bVar1) {
    TypeChecker::getType(local_f0);
    VariableAnalyser::getType(local_88);
    local_1d9 = std::operator!=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  if (local_1d9 != false) {
    TypeChecker::getType(local_f0);
    __lhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::optional<TypeName>::value((optional<TypeName> *)in_stack_fffffffffffffdf0);
    __rhs_00 = std::
               unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at((unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
    std::operator+((char *)__lhs,__rhs);
    std::operator+(__lhs_00,(char *)__rhs_00);
    std::operator+(__lhs_00,__rhs_00);
    std::operator+(__lhs_00,(char *)__rhs_00);
    reportError((string *)in_RSI,in_stack_ffffffffffffffe8);
  }
  TypeChecker::~TypeChecker((TypeChecker *)0x179ccf);
  VariableAnalyser::~VariableAnalyser((VariableAnalyser *)0x179cdc);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void SemanticAnalyser::visit(const AssignmentNode& node) 
{
  const auto name = node.getName();
  const auto symbol = symbols_.lookup(name);
  if(!symbol)
    reportError("Assignment to undeclared variable " + name, node);

  VariableAnalyser analyser{};
  symbol.value().get().accept(analyser);
  if(!analyser.isSymbolValid())
    reportError("Assignment to a non-variable symbol " + name, node);

  if(analyser.getType() == TypeName::Function && node.getOperation() != AssignmentOperator::Assign)
    reportError("Cannot perform arithmetic operation on function variable " + name, node);

  node.getValue()->accept(*this);

  TypeChecker typeChecker{symbols_};
  node.getValue()->accept(typeChecker);

  // Type checker is not able to deduce expression's type when variable was called
  // and in that case getType has no value.
  if(typeChecker.getType().has_value() && typeChecker.getType() != analyser.getType())
    reportError("Cannot assign value of type " + 
      TypeNameStrings.at(typeChecker.getType().value()) + " to variable " + name + "!", node);
}